

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder_&()>::UntypedPerformAction
          (FunctionMockerBase<MockProblemBuilder_&()> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<MockProblemBuilder_&> *pAVar1;
  Action<MockProblemBuilder_&()> action;
  linked_ptr<testing::ActionInterface<MockProblemBuilder_&()>_> local_20;
  
  linked_ptr<testing::ActionInterface<MockProblemBuilder&()>>::
  copy<testing::ActionInterface<MockProblemBuilder&()>>
            ((linked_ptr<testing::ActionInterface<MockProblemBuilder&()>> *)&local_20,
             (linked_ptr<testing::ActionInterface<MockProblemBuilder_&()>_> *)untyped_action);
  pAVar1 = ActionResultHolder<MockProblemBuilder&>::PerformAction<MockProblemBuilder&()>
                     ((Action<MockProblemBuilder_&()> *)&local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<MockProblemBuilder_&()>_>::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }